

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_MultipleArgs_Test::TestBody(SubcommandProgram_MultipleArgs_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  AssertHelper local_c8;
  Message local_c0;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_b8;
  size_type local_a0;
  unsigned_long local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_MultipleArgs_Test *this_local;
  
  gtest_ar.message_.ptr_._2_1_ = 1;
  local_68 = &local_60;
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"start",&local_69);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"stop",(allocator *)((long)&gtest_ar.message_.ptr_ + 3));
  gtest_ar.message_.ptr_._2_1_ = 0;
  local_20 = &local_60;
  local_18 = 2;
  __l._M_len = 2;
  __l._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_f8 = local_f8 + -1;
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_f8 != &local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  TApp::run((TApp *)this);
  local_98 = 2;
  CLI::App::get_subcommands(&local_b8,&(this->super_SubcommandProgram).super_TApp.app,true);
  local_a0 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_b8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_90,"(size_t)2","app.get_subcommands().size()",&local_98,
             &local_a0);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1e5,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MultipleArgs) {
    args = {"start", "stop"};

    run();

    EXPECT_EQ((size_t)2, app.get_subcommands().size());
}